

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O0

void draco::parser::SkipWhitespace(DecoderBuffer *buffer)

{
  bool bVar1;
  DecoderBuffer *in_RDI;
  bool end_reached;
  undefined6 in_stack_fffffffffffffff0;
  byte in_stack_fffffffffffffff6;
  byte bVar2;
  
  bVar2 = 0;
  while( true ) {
    bVar1 = PeekWhitespace(in_RDI,(bool *)CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffff6,
                                                                  in_stack_fffffffffffffff0)));
    in_stack_fffffffffffffff6 = 0;
    if (bVar1) {
      in_stack_fffffffffffffff6 = bVar2 ^ 0xff;
    }
    if ((in_stack_fffffffffffffff6 & 1) == 0) break;
    DecoderBuffer::Advance(in_RDI,1);
  }
  return;
}

Assistant:

void SkipWhitespace(DecoderBuffer *buffer) {
  bool end_reached = false;
  while (PeekWhitespace(buffer, &end_reached) && !end_reached) {
    // Skip the whitespace character
    buffer->Advance(1);
  }
}